

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:232:30),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_siginfo_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:232:30),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::_::Void> *pEVar1;
  anon_struct_128_5_975a5653_for_value *in_00;
  Void local_649;
  ExceptionOr<kj::_::Void> local_648;
  anon_struct_128_5_975a5653_for_value *local_4e0;
  anon_struct_128_5_975a5653_for_value *depValue;
  ExceptionOr<kj::_::Void> local_380;
  Exception *local_218;
  Exception *depException;
  undefined1 local_200 [8];
  ExceptionOr<siginfo_t> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::_::Void,_siginfo_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:232:30),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.field_1._120_8_ = output;
  ExceptionOr<siginfo_t>::ExceptionOr((ExceptionOr<siginfo_t> *)local_200);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_200);
  local_218 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_200);
  if (local_218 == (Exception *)0x0) {
    local_4e0 = readMaybe<siginfo_t>
                          ((Maybe<siginfo_t> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_4e0 != (anon_struct_128_5_975a5653_for_value *)0x0) {
      in_00 = mv<siginfo_t>(local_4e0);
      MaybeVoidCaller<siginfo_t,kj::_::Void>::
      apply<kj::(anonymous_namespace)::TestCase222::run()::__0>(&this->func,in_00);
      handle(&local_648,this,&local_649);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._120_8_);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_648);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_648);
    }
  }
  else {
    in = mv<kj::Exception>(local_218);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x28,in)
    ;
    handle(&local_380,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::_::Void>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._120_8_);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_380);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_380);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<siginfo_t>::~ExceptionOr((ExceptionOr<siginfo_t> *)local_200);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }